

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

void * install_response_handler
                 (CManager cm,int stone_id,char *response_spec,void *param_4,FMFormat **ref_ptr)

{
  FMFormat **ppp_Var1;
  CManager p_Var2;
  void *pvVar3;
  int iVar4;
  char *pcVar5;
  FMStructDescRec *pFVar6;
  long lVar7;
  undefined4 *puVar8;
  FMStructDescList p_Var9;
  FMStructDescList p_Var10;
  size_t sVar11;
  char *pcVar12;
  void *pvVar13;
  FMFormat p_Var14;
  FMFormat *pp_Var15;
  int iVar16;
  FMStructDescList f;
  FMStructDescRec *pFVar17;
  long lVar18;
  int format_count;
  int format_count2;
  int local_60;
  int local_5c;
  FMFormat **local_58;
  CManager local_50;
  void *local_48;
  undefined4 *local_40;
  void *local_38;
  
  local_50 = cm;
  iVar4 = strncmp("Terminal Action",response_spec,0xf);
  if (iVar4 == 0) {
    __isoc99_sscanf(response_spec + 0x10,"  Format Count %d\n",&local_60);
    pcVar5 = strchr(response_spec + 0x10,10);
    response_spec = pcVar5 + 1;
    pFVar6 = (FMStructDescRec *)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
    lVar7 = (long)local_60;
    if (0 < lVar7) {
      lVar18 = 0;
      pFVar17 = pFVar6;
      do {
        response_spec = parse_FMformat_from_string(response_spec,pFVar17);
        lVar18 = lVar18 + 1;
        lVar7 = (long)local_60;
        pFVar17 = pFVar17 + 1;
      } while (lVar18 < lVar7);
    }
    pFVar6[lVar7].format_name = (char *)0x0;
  }
  iVar4 = strncmp("Filter Action",response_spec,0xd);
  local_58 = ref_ptr;
  if (iVar4 == 0) {
    puVar8 = (undefined4 *)INT_CMmalloc(0x48);
    __isoc99_sscanf(response_spec + 0xe,"  Format Count %d\n",&local_60);
    pcVar5 = strchr(response_spec + 0xe,10);
    pcVar5 = pcVar5 + 1;
    p_Var9 = (FMStructDescList)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
    lVar7 = (long)local_60;
    if (0 < lVar7) {
      lVar18 = 0;
      p_Var10 = p_Var9;
      do {
        pcVar5 = parse_FMformat_from_string(pcVar5,p_Var10);
        lVar18 = lVar18 + 1;
        lVar7 = (long)local_60;
        p_Var10 = p_Var10 + 1;
      } while (lVar18 < lVar7);
    }
    p_Var9[lVar7].format_name = (char *)0x0;
    sVar11 = strlen(pcVar5);
    pcVar12 = (char *)INT_CMmalloc(sVar11 + 1);
    strcpy(pcVar12,pcVar5);
    *puVar8 = 0;
  }
  else {
    iVar4 = strncmp("Router Action",response_spec,0xd);
    if (iVar4 != 0) {
      iVar4 = strncmp("Transform Action",response_spec,0x10);
      local_48 = param_4;
      if (iVar4 == 0) {
        local_40 = (undefined4 *)INT_CMmalloc(0x48);
        __isoc99_sscanf(response_spec + 0x11,"  Input Format Count %d\n",&local_60);
        pcVar5 = strchr(response_spec + 0x11,10);
        pcVar5 = pcVar5 + 1;
        p_Var9 = (FMStructDescList)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
        lVar7 = (long)local_60;
        if (0 < lVar7) {
          lVar18 = 0;
          p_Var10 = p_Var9;
          do {
            pcVar5 = parse_FMformat_from_string(pcVar5,p_Var10);
            lVar18 = lVar18 + 1;
            lVar7 = (long)local_60;
            p_Var10 = p_Var10 + 1;
          } while (lVar18 < lVar7);
        }
        p_Var9[lVar7].format_name = (char *)0x0;
        p_Var9[lVar7].field_list = (FMFieldList)0x0;
        iVar4 = __isoc99_sscanf(pcVar5,"  Output Format Count %d\n",&local_60);
        if (iVar4 == 1) {
          pcVar5 = strchr(pcVar5,10);
          pcVar5 = pcVar5 + 1;
          p_Var10 = (FMStructDescList)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
          lVar7 = (long)local_60;
          if (0 < lVar7) {
            lVar18 = 0;
            f = p_Var10;
            do {
              pcVar5 = parse_FMformat_from_string(pcVar5,f);
              lVar18 = lVar18 + 1;
              lVar7 = (long)local_60;
              f = f + 1;
            } while (lVar18 < lVar7);
          }
          p_Var10[lVar7].format_name = (char *)0x0;
          p_Var10[lVar7].field_list = (FMFieldList)0x0;
          sVar11 = strlen(pcVar5);
          pcVar12 = (char *)INT_CMmalloc(sVar11 + 1);
          strcpy(pcVar12,pcVar5);
          puVar8 = local_40;
          p_Var2 = local_50;
          *local_40 = 1;
          *(FMStructDescList *)(local_40 + 2) = p_Var9;
          *(FMStructDescList *)(local_40 + 4) = p_Var10;
          *(char **)(local_40 + 6) = pcVar12;
          *(void **)(local_40 + 8) = local_48;
          *(undefined8 *)(local_40 + 10) = 0;
          if (p_Var9->format_name != (char *)0x0) {
            p_Var14 = EVregister_format_set(local_50,p_Var9);
            *(FMFormat *)(puVar8 + 10) = p_Var14;
          }
          if (ref_ptr != (FMFormat **)0x0) {
            pp_Var15 = (FMFormat *)INT_CMmalloc(0x10);
            pp_Var15[1] = (FMFormat)0x0;
            *pp_Var15 = *(FMFormat *)(puVar8 + 10);
            *ref_ptr = pp_Var15;
          }
          if (p_Var10->format_name != (char *)0x0) {
            p_Var14 = EVregister_format_set(p_Var2,p_Var10);
            *(FMFormat *)(puVar8 + 0xc) = p_Var14;
          }
          puVar8[0x10] = p_Var10->struct_size;
          return puVar8;
        }
        puts("output format parse failed");
        return (void *)0x0;
      }
      iVar4 = strncmp("Multityped Action",response_spec,0x11);
      if (iVar4 != 0) {
        printf("Unparsed action : %s\n",response_spec);
        return (void *)0x0;
      }
      local_40 = (undefined4 *)INT_CMmalloc(0x48);
      iVar4 = 0;
      __isoc99_sscanf(response_spec + 0x12,"  List Count %d\n",&local_60);
      pcVar5 = strchr(response_spec + 0x12,10);
      pcVar5 = pcVar5 + 1;
      local_38 = INT_CMmalloc((long)local_60 * 8 + 8);
      if (0 < local_60) {
        iVar4 = 0;
        iVar16 = 0;
        do {
          __isoc99_sscanf(pcVar5,"Next format   Subformat Count %d\n",&local_5c);
          pcVar5 = strchr(pcVar5,10);
          pcVar5 = pcVar5 + 1;
          pFVar6 = (FMStructDescRec *)INT_CMmalloc((long)local_5c * 0x20 + 0x20);
          lVar7 = (long)local_5c;
          if (0 < lVar7) {
            lVar18 = 0;
            pFVar17 = pFVar6;
            do {
              pcVar5 = parse_FMformat_from_string(pcVar5,pFVar17);
              lVar18 = lVar18 + 1;
              lVar7 = (long)local_5c;
              pFVar17 = pFVar17 + 1;
            } while (lVar18 < lVar7);
          }
          pvVar3 = local_38;
          pFVar6[lVar7].format_name = (char *)0x0;
          pFVar6[lVar7].field_list = (FMFieldList)0x0;
          *(FMStructDescRec **)((long)local_38 + (long)iVar16 * 8) = pFVar6;
          if (pFVar6->field_list == (FMFieldList)0x0) {
            free(pFVar6->format_name);
            free(pFVar6);
            *(undefined8 *)((long)pvVar3 + (long)iVar16 * 8) = 0;
            local_60 = local_60 + -1;
            iVar4 = iVar4 + 1;
          }
          else {
            iVar16 = iVar16 + 1;
          }
        } while (iVar16 < local_60);
      }
      pvVar3 = local_38;
      *(undefined8 *)((long)local_38 + (long)local_60 * 8) = 0;
      sVar11 = strlen(pcVar5);
      pcVar12 = (char *)INT_CMmalloc(sVar11 + 1);
      strcpy(pcVar12,pcVar5);
      puVar8 = local_40;
      *local_40 = 3;
      *(void **)(local_40 + 2) = pvVar3;
      *(char **)(local_40 + 4) = pcVar12;
      *(void **)(local_40 + 6) = local_48;
      local_40[8] = iVar4;
      pvVar13 = INT_CMmalloc((long)local_60 * 8 + 8);
      p_Var2 = local_50;
      ppp_Var1 = local_58;
      *(void **)(puVar8 + 10) = pvVar13;
      iVar4 = local_60;
      if (0 < local_60) {
        lVar7 = 0;
        do {
          p_Var9 = *(FMStructDescList *)((long)pvVar3 + lVar7 * 8);
          if (p_Var9->format_name != (char *)0x0) {
            p_Var14 = EVregister_format_set(p_Var2,p_Var9);
            *(FMFormat *)(*(long *)(puVar8 + 10) + lVar7 * 8) = p_Var14;
            iVar4 = local_60;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar4);
      }
      if (ppp_Var1 == (FMFormat **)0x0) {
        return puVar8;
      }
      pp_Var15 = (FMFormat *)INT_CMmalloc((long)iVar4 * 8 + 8);
      lVar7 = (long)local_60;
      if (0 < lVar7) {
        lVar18 = 0;
        do {
          pp_Var15[lVar18] = *(FMFormat *)(*(long *)(puVar8 + 10) + lVar18 * 8);
          lVar18 = lVar18 + 1;
        } while (lVar7 != lVar18);
      }
      pp_Var15[lVar7] = (FMFormat)0x0;
      *ppp_Var1 = pp_Var15;
      return puVar8;
    }
    puVar8 = (undefined4 *)INT_CMmalloc(0x48);
    __isoc99_sscanf(response_spec + 0xe,"  Format Count %d\n",&local_60);
    pcVar5 = strchr(response_spec + 0xe,10);
    pcVar5 = pcVar5 + 1;
    p_Var9 = (FMStructDescList)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
    lVar7 = (long)local_60;
    if (0 < lVar7) {
      lVar18 = 0;
      p_Var10 = p_Var9;
      do {
        pcVar5 = parse_FMformat_from_string(pcVar5,p_Var10);
        lVar18 = lVar18 + 1;
        lVar7 = (long)local_60;
        p_Var10 = p_Var10 + 1;
      } while (lVar18 < lVar7);
    }
    p_Var9[lVar7].format_name = (char *)0x0;
    sVar11 = strlen(pcVar5);
    pcVar12 = (char *)INT_CMmalloc(sVar11 + 1);
    strcpy(pcVar12,pcVar5);
    *puVar8 = 2;
  }
  *(FMStructDescList *)(puVar8 + 2) = p_Var9;
  *(char **)(puVar8 + 4) = pcVar12;
  *(void **)(puVar8 + 6) = param_4;
  p_Var14 = EVregister_format_set(local_50,p_Var9);
  ppp_Var1 = local_58;
  *(FMFormat *)(puVar8 + 8) = p_Var14;
  if (local_58 != (FMFormat **)0x0) {
    pp_Var15 = (FMFormat *)INT_CMmalloc(0x10);
    pp_Var15[1] = (FMFormat)0x0;
    *pp_Var15 = *(FMFormat *)(puVar8 + 8);
    *ppp_Var1 = pp_Var15;
  }
  return puVar8;
}

Assistant:

void *
install_response_handler(CManager cm, int stone_id, char *response_spec,
			 void *local_data, FMFormat **ref_ptr)
{
    char *str = response_spec;
    (void)stone_id;
    if (strncmp("Terminal Action", str, strlen("Terminal Action")) == 0) {
	int format_count, i;
	FMStructDescList list;
	str += strlen("Terminal Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
/*	INT_EVassoc_terminal_action(cm, stone_id, list, local_data, NULL);*/
    }
    if (strncmp("Filter Action", str, strlen("Filter Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList list;
	str += strlen("Filter Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Filter;
	response->u.filter.format_list = list;
	response->u.filter.function = function;
	response->u.filter.client_data = local_data;
	response->u.filter.reference_format =
	    EVregister_format_set(cm, list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.filter.reference_format;

	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    if (strncmp("Router Action", str, strlen("Router Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList list;
	str += strlen("Router Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Router;
	response->u.filter.format_list = list;
	response->u.filter.function = function;
	response->u.filter.client_data = local_data;
	response->u.filter.reference_format =
	    EVregister_format_set(cm, list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.filter.reference_format;

	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    if (strncmp("Transform Action", str, strlen("Transform Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList in_list, out_list;
	str += strlen("Transform Action") + 1;
	sscanf(str, "  Input Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	in_list = malloc(sizeof(in_list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &in_list[i]);
	}
	in_list[format_count].format_name = NULL;
	in_list[format_count].field_list = NULL;
	if (sscanf(str, "  Output Format Count %d\n", &format_count) != 1) {
	    printf("output format parse failed\n");
	    return 0;
	}
	str = strchr(str, '\n') + 1;
	out_list = malloc(sizeof(out_list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &out_list[i]);
	}
	out_list[format_count].format_name = NULL;
	out_list[format_count].field_list = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Transform;
	response->u.transform.in_format_list = in_list;
	response->u.transform.out_format_list = out_list;
	response->u.transform.function = function;
	response->u.transform.client_data = local_data;
	response->u.transform.reference_input_format = NULL;
	if (in_list[0].format_name != NULL)
	    response->u.transform.reference_input_format =
		EVregister_format_set(cm, in_list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.transform.reference_input_format;
	    *ref_ptr = formats;
	}
	if (out_list[0].format_name != NULL)
	    response->u.transform.reference_output_format =
		EVregister_format_set(cm, out_list);
	response->u.transform.output_base_struct_size = out_list[0].struct_size;
	return (void*)response;
    }
    if (strncmp("Multityped Action", str, strlen("Multityped Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int list_count, j;
	char *function;
	FMStructDescList *struct_list;
	int accept_anonymous = 0;

	str += strlen("Multityped Action") + 1;
	sscanf(str, "  List Count %d\n", &list_count);
	str = strchr(str, '\n') + 1;
	struct_list = malloc(sizeof(struct_list[0]) * (list_count + 1));
	for (j = 0; j < list_count; j++) {
	    int format_count2, k;
	    FMStructDescList in_list;
	    sscanf(str, "Next format   Subformat Count %d\n", &format_count2);
	    str = strchr(str, '\n') + 1;

	    in_list = malloc(sizeof(in_list[0]) * (format_count2 + 1));
	    for (k=0; k < format_count2; k++) {
		str = parse_FMformat_from_string(str, &in_list[k]);
	    }
	    in_list[format_count2].format_name = NULL;
	    in_list[format_count2].field_list = NULL;
	    struct_list[j] = in_list;
	    if (struct_list[j]->field_list == NULL) {  /* anonymous */
		free((void*)struct_list[j]->format_name);
		free(in_list);
		struct_list[j] = NULL;
		list_count--;
		j--;
		accept_anonymous++;
	    }
	}
	struct_list[list_count] = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Multityped;
	response->u.multityped.struct_list = struct_list;
	response->u.multityped.function = function;
	response->u.multityped.client_data = local_data;
	response->u.multityped.accept_anonymous = accept_anonymous;
	response->u.multityped.reference_input_format_list =
	    malloc((list_count +1) * sizeof(FMFormat));
	for (j = 0; j < list_count; j++) {
	    if ((struct_list[j])[0].format_name != NULL) {
		response->u.multityped.reference_input_format_list[j] =
		    EVregister_format_set(cm, struct_list[j]);
	    }
	}
	if (ref_ptr) {
	    FMFormat *formats = malloc((list_count + 1)*sizeof(FMFormat));
	    int k = 0;
	    for (k=0; k < list_count; k++) {
		formats[k] = response->u.multityped.reference_input_format_list[k];
	    }
	    formats[list_count] = NULL;
	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    printf("Unparsed action : %s\n", str);
    return NULL;
}